

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkAddDummyPoNames(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar6 = pNtk->vPos->nSize;
  if (1 < uVar6) {
    uVar5 = 0;
    uVar3 = uVar6 - 1;
    uVar6 = uVar5;
    if (uVar3 != 0) {
      do {
        uVar6 = uVar5 + 1;
        bVar2 = 9 < uVar3;
        uVar5 = uVar6;
        uVar3 = uVar3 / 10;
      } while (bVar2);
    }
  }
  pVVar4 = pNtk->vPos;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      plVar1 = (long *)pVVar4->pArray[lVar7];
      sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d","po",(ulong)uVar6);
      Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2],
                        *(uint *)((long)plVar1 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0);
      lVar7 = lVar7 + 1;
      pVVar4 = pNtk->vPos;
    } while (lVar7 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkAddDummyPoNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nDigits, i;
    nDigits = Abc_Base10Log( Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("po", i, nDigits), NULL );
}